

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::decodePaeth(Pl_PNGFilter *this)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  uint local_34;
  int upper_left;
  int up;
  int left;
  uint i;
  uint bpp;
  uchar *above_buffer;
  uchar *buffer;
  Pl_PNGFilter *this_local;
  
  QTC::TC("libtests","Pl_PNGFilter decodePaeth",0);
  puVar3 = this->cur_row;
  puVar4 = this->prev_row;
  uVar2 = this->bytes_per_pixel;
  for (up = 0; (uint)up < this->bytes_per_row; up = up + 1) {
    upper_left = 0;
    local_34 = 0;
    if (uVar2 <= (uint)up) {
      upper_left = (int)puVar3[(ulong)(up - uVar2) + 1];
      local_34 = (uint)puVar4[(ulong)(up - uVar2) + 1];
    }
    uVar1 = puVar3[(ulong)(uint)up + 1];
    iVar5 = PaethPredictor(this,upper_left,(uint)puVar4[(ulong)(uint)up + 1],local_34);
    puVar3[(ulong)(uint)up + 1] = uVar1 + (char)iVar5;
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodePaeth()
{
    QTC::TC("libtests", "Pl_PNGFilter decodePaeth");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        int left = 0;
        int up = above_buffer[i];
        int upper_left = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
            upper_left = above_buffer[i - bpp];
        }

        buffer[i] =
            static_cast<unsigned char>(buffer[i] + this->PaethPredictor(left, up, upper_left));
    }
}